

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall pugi::xml_node::insert_move_after(xml_node *this,xml_node *moved,xml_node *node)

{
  xml_node child;
  xml_node_struct *pxVar1;
  bool bVar2;
  xml_node xVar3;
  xml_document_struct *pxVar4;
  
  xVar3 = (xml_node)this->_root;
  child = (xml_node)moved->_root;
  bVar2 = impl::anon_unknown_0::allow_move(xVar3,child);
  if (((bVar2) && (pxVar1 = node->_root, pxVar1 != (xml_node_struct *)0x0)) &&
     (child._root != pxVar1 && pxVar1->parent == xVar3._root)) {
    impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(xVar3._root);
    pxVar4 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>(this->_root);
    *(byte *)&(pxVar4->super_xml_node_struct).header =
         (byte)(pxVar4->super_xml_node_struct).header | 0x40;
    impl::anon_unknown_0::remove_node(moved->_root);
    impl::anon_unknown_0::insert_node_after(moved->_root,node->_root);
    xVar3 = (xml_node)moved->_root;
  }
  else {
    xVar3._root = (xml_node_struct *)0x0;
  }
  return (xml_node)xVar3._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_after(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		// disable document_buffer_order optimization since moving nodes around changes document order without changing buffer pointers
		impl::get_document(_root).header |= impl::xml_memory_page_contents_shared_mask;

		impl::remove_node(moved._root);
		impl::insert_node_after(moved._root, node._root);

		return moved;
	}